

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O1

bool D_LoadDehFile(char *patchfile)

{
  bool bVar1;
  byte bVar2;
  int lumpnum;
  FILE *__stream;
  size_t __n;
  FString *unaff_R14;
  FString filebase;
  FString local_20;
  
  __stream = fopen(patchfile,"rb");
  if (__stream != (FILE *)0x0) {
    PatchSize = Q_filelength((FILE *)__stream);
    PatchName = copystring(patchfile);
    __n = (size_t)PatchSize;
    PatchFile = (char *)operator_new__(__n + 1);
    fread(PatchFile,1,__n,__stream);
    fclose(__stream);
    PatchFile[PatchSize] = '\0';
    bVar1 = DoDehPatch();
    return bVar1;
  }
  lumpnum = FWadCollection::CheckNumForFullName(&Wads,patchfile,true,0);
  if (lumpnum < 0) {
    unaff_R14 = &local_20;
    ExtractFileBase((char *)unaff_R14,SUB81(patchfile,0));
    lumpnum = FWadCollection::CheckNumForName(&Wads,local_20.Chars,0);
    FString::~FString(&local_20);
  }
  bVar2 = (byte)unaff_R14;
  if (-1 < lumpnum) {
    bVar2 = D_LoadDehLump(lumpnum);
  }
  if (lumpnum < 0) {
    bVar2 = 0;
    Printf("Could not open DeHackEd patch \"%s\"\n",patchfile);
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool D_LoadDehFile(const char *patchfile)
{
	FILE *deh;

	deh = fopen(patchfile, "rb");
	if (deh != NULL)
	{
		PatchSize = Q_filelength(deh);

		PatchName = copystring(patchfile);
		PatchFile = new char[PatchSize + 1];
		fread(PatchFile, 1, PatchSize, deh);
		fclose(deh);
		PatchFile[PatchSize] = '\0';		// terminate with a '\0' character
		return DoDehPatch();
	}
	else
	{
		// Couldn't find it in the filesystem; try from a lump instead.
		int lumpnum = Wads.CheckNumForFullName(patchfile, true);
		if (lumpnum < 0)
		{
			// Compatibility fallback. It's just here because
			// some WAD may need it. Should be deleted if it can
			// be confirmed that nothing uses this case.
			FString filebase(ExtractFileBase(patchfile));
			lumpnum = Wads.CheckNumForName(filebase);
		}
		if (lumpnum >= 0)
		{
			return D_LoadDehLump(lumpnum);
		}
	}
	Printf ("Could not open DeHackEd patch \"%s\"\n", patchfile);
	return false;
}